

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_> __thiscall
Parser::parseFunctionCall(Parser *this,optional<Token> *identifierToken)

{
  _Variadic_union<double> _Var1;
  _Variadic_union<double> _Var2;
  _Variadic_union<double> _Var3;
  Mark *pMVar4;
  variant_alternative_t<0UL,_variant<basic_string<char>,_double>_> *pvVar5;
  FunctionCallNode *this_00;
  Token *pTVar6;
  istream *piVar7;
  istream *piVar8;
  long in_RDX;
  pointer *__ptr;
  list<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_> arguments
  ;
  string name;
  _Variadic_union<double> local_100;
  _Variadic_union<double> local_f8;
  _Variadic_union<double> local_f0;
  _Variadic_union<double> local_e8;
  _Variadic_union<double> local_e0;
  undefined1 local_d8 [16];
  Token local_c8;
  string local_90;
  Mark local_70;
  Token local_68;
  
  pMVar4 = Stream::getMark((Stream *)identifierToken);
  local_70 = *pMVar4;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  local_90._M_string_length = 0;
  local_90.field_2._M_local_buf[0] = '\0';
  if (*(char *)(in_RDX + 0x38) == '\x01') {
    std::get<0ul,std::__cxx11::string,double>
              ((variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
                *)(in_RDX + 8));
    std::__cxx11::string::_M_assign((string *)&local_90);
  }
  else {
    pTVar6 = Tokenizer::peek((Tokenizer *)identifierToken);
    if (pTVar6->type - KeywordIf < 2) {
      pTVar6 = Tokenizer::peek((Tokenizer *)identifierToken);
      std::get<0ul,std::__cxx11::string,double>(&pTVar6->value);
      std::__cxx11::string::_M_assign((string *)&local_90);
      Tokenizer::nextToken(&local_68,(Tokenizer *)identifierToken);
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_&>
        ::_S_vtable._M_arr
        [local_68.value.
         super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
         .super__Move_assign_alias<std::__cxx11::basic_string<char>,_double>.
         super__Copy_assign_alias<std::__cxx11::basic_string<char>,_double>.
         super__Move_ctor_alias<std::__cxx11::basic_string<char>,_double>.
         super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_double>.
         super__Variant_storage_alias<std::__cxx11::basic_string<char>,_double>._M_index]._M_data)
                ((anon_class_1_0_00000001 *)(local_d8 + 0x10),&local_68.value);
      local_68.value.
      super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
      .super__Move_assign_alias<std::__cxx11::basic_string<char>,_double>.
      super__Copy_assign_alias<std::__cxx11::basic_string<char>,_double>.
      super__Move_ctor_alias<std::__cxx11::basic_string<char>,_double>.
      super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_double>.
      super__Variant_storage_alias<std::__cxx11::basic_string<char>,_double>._M_index = 0xff;
    }
    else {
      local_e8 = (_Variadic_union<double>)local_d8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_e8,"Expected function name!","");
      getToken((Token *)(local_d8 + 0x10),(Parser *)identifierToken,Identifier,
               (string *)&local_e8._M_first);
      pvVar5 = std::get<0ul,std::__cxx11::string,double>(&local_c8.value);
      std::__cxx11::string::operator=((string *)&local_90,(string *)pvVar5);
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_&>
        ::_S_vtable._M_arr
        [local_c8.value.
         super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
         .super__Move_assign_alias<std::__cxx11::basic_string<char>,_double>.
         super__Copy_assign_alias<std::__cxx11::basic_string<char>,_double>.
         super__Move_ctor_alias<std::__cxx11::basic_string<char>,_double>.
         super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_double>.
         super__Variant_storage_alias<std::__cxx11::basic_string<char>,_double>._M_index]._M_data)
                ((anon_class_1_0_00000001 *)&local_100._M_first,&local_c8.value);
      local_c8.value.
      super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
      .super__Move_assign_alias<std::__cxx11::basic_string<char>,_double>.
      super__Copy_assign_alias<std::__cxx11::basic_string<char>,_double>.
      super__Move_ctor_alias<std::__cxx11::basic_string<char>,_double>.
      super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_double>.
      super__Variant_storage_alias<std::__cxx11::basic_string<char>,_double>._M_index = 0xff;
      if (local_e8 != (_Variadic_union<double>)local_d8) {
        operator_delete((void *)local_e8,local_d8._0_8_ + 1);
      }
    }
  }
  parseCallArgumentList_abi_cxx11_
            ((list<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_>
              *)&local_100._M_first,(Parser *)identifierToken);
  this_00 = (FunctionCallNode *)operator_new(0x48);
  local_c8._0_8_ = local_100;
  local_c8.value.
  super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
  .super__Move_assign_alias<std::__cxx11::basic_string<char>,_double>.
  super__Copy_assign_alias<std::__cxx11::basic_string<char>,_double>.
  super__Move_ctor_alias<std::__cxx11::basic_string<char>,_double>.
  super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_double>.
  super__Variant_storage_alias<std::__cxx11::basic_string<char>,_double>._M_u._M_rest = local_f8;
  local_c8.value.
  super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
  .super__Move_assign_alias<std::__cxx11::basic_string<char>,_double>.
  super__Copy_assign_alias<std::__cxx11::basic_string<char>,_double>.
  super__Move_ctor_alias<std::__cxx11::basic_string<char>,_double>.
  super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_double>.
  super__Variant_storage_alias<std::__cxx11::basic_string<char>,_double>._M_u._8_8_ = local_f0;
  if (local_100 == (_Variadic_union<double>)&local_100) {
    local_c8._0_8_ = (long)local_d8 + 0x10;
    local_c8.value.
    super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
    .super__Move_assign_alias<std::__cxx11::basic_string<char>,_double>.
    super__Copy_assign_alias<std::__cxx11::basic_string<char>,_double>.
    super__Move_ctor_alias<std::__cxx11::basic_string<char>,_double>.
    super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_double>.
    super__Variant_storage_alias<std::__cxx11::basic_string<char>,_double>._M_u._M_rest =
         (_Variadic_union<double>)local_c8._0_8_;
  }
  else {
    *(long *)local_f8 = (long)local_d8 + 0x10;
    *(long *)((long)local_100 + 8) = (long)local_d8 + 0x10;
    local_f0 = (_Variadic_union<double>)0x0;
    local_100 = (_Variadic_union<double>)&local_100;
    local_f8 = (_Variadic_union<double>)&local_100;
  }
  FunctionCallNode::FunctionCallNode
            (this_00,&local_90,
             (list<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_>
              *)(local_d8 + 0x10));
  std::__cxx11::
  _List_base<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_>::
  _M_clear((_List_base<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_>
            *)(local_d8 + 0x10));
  (this->tokenizer_).stream_.is_ = (istream *)this_00;
  pTVar6 = Tokenizer::peek((Tokenizer *)identifierToken);
  local_c8.type = pTVar6->type;
  std::__detail::__variant::
  _Copy_ctor_base<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
  ::_Copy_ctor_base((_Copy_ctor_base<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
                     *)&local_c8.value,
                    (_Copy_ctor_base<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
                     *)&pTVar6->value);
  local_c8.mark = pTVar6->mark;
  if (local_c8.type == 0x29) {
    do {
      parseCallArgumentList_abi_cxx11_
                ((list<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_>
                  *)&local_e8._M_first,(Parser *)identifierToken);
      std::__cxx11::
      list<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_>::
      _M_move_assign((list<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_>
                      *)&local_100,&local_e8);
      std::__cxx11::
      _List_base<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_>
      ::_M_clear((_List_base<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_>
                  *)&local_e8._M_first);
      piVar8 = (this->tokenizer_).stream_.is_;
      (this->tokenizer_).stream_.is_ = (istream *)0x0;
      piVar7 = (istream *)operator_new(0x30);
      _Var1 = local_f0;
      local_e8 = local_100;
      local_e0 = local_f8;
      local_d8._0_8_ = local_f0;
      _Var2 = (_Variadic_union<double>)&local_e8;
      _Var3 = (_Variadic_union<double>)&local_e8;
      if (local_100 != (_Variadic_union<double>)&local_100) {
        *(_Variadic_union<double> **)local_f8 = &local_e8;
        *(_Variadic_union<double> **)&((_Variadic_union<double> *)((long)local_e8 + 8))->_M_rest =
             &local_e8;
        local_f0 = (_Variadic_union<double>)0x0;
        local_100 = (_Variadic_union<double>)&local_100;
        local_f8 = (_Variadic_union<double>)&local_100;
        _Var2 = local_e8;
        _Var3 = local_e0;
      }
      local_e0 = _Var3;
      local_e8 = _Var2;
      *(undefined8 *)(piVar7 + 8) = 1;
      *(undefined ***)piVar7 = &PTR__FunctionResultCallNode_001f4ec8;
      *(istream **)(piVar7 + 0x10) = piVar8;
      piVar8 = piVar7 + 0x18;
      *(_Variadic_union<double> *)(piVar7 + 0x18) = local_e8;
      *(_Variadic_union<double> *)&((_Variadic_union<double> *)(piVar7 + 0x20))->_M_rest = local_e0;
      *(_Variadic_union<double> *)(piVar7 + 0x28) = _Var1;
      if (local_e8 == (_Variadic_union<double>)&local_e8) {
        *(istream **)(piVar7 + 0x20) = piVar8;
        *(istream **)(piVar7 + 0x18) = piVar8;
      }
      else {
        *(istream **)local_e0 = piVar8;
        *(istream **)(*(long *)piVar8 + 8) = piVar8;
        local_d8._0_8_ = (_Variadic_union<double>)0x0;
        local_e8 = (_Variadic_union<double>)&local_e8;
        local_e0 = (_Variadic_union<double>)&local_e8;
      }
      std::__cxx11::
      _List_base<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_>
      ::_M_clear((_List_base<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_>
                  *)&local_e8._M_first);
      (this->tokenizer_).stream_.is_ = piVar7;
      pTVar6 = Tokenizer::peek((Tokenizer *)identifierToken);
      local_c8.type = pTVar6->type;
      local_e8 = (_Variadic_union<double>)&local_c8.value;
      (*std::__detail::__variant::
        __gen_vtable<std::__detail::__variant::__variant_idx_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:609:4)_&&,_const_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_&>
        ::_S_vtable._M_arr
        [(pTVar6->value).
         super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
         .super__Move_assign_alias<std::__cxx11::basic_string<char>,_double>.
         super__Copy_assign_alias<std::__cxx11::basic_string<char>,_double>.
         super__Move_ctor_alias<std::__cxx11::basic_string<char>,_double>.
         super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_double>.
         super__Variant_storage_alias<std::__cxx11::basic_string<char>,_double>._M_index]._M_data)
                ((anon_class_8_1_8991fb9c_conflict *)&local_e8._M_first,&pTVar6->value);
      local_c8.mark = pTVar6->mark;
    } while (local_c8.type == 0x29);
  }
  *(Mark *)((this->tokenizer_).stream_.is_ + 8) = local_70;
  (*std::__detail::__variant::
    __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_&>
    ::_S_vtable._M_arr
    [local_c8.value.
     super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
     .super__Move_assign_alias<std::__cxx11::basic_string<char>,_double>.
     super__Copy_assign_alias<std::__cxx11::basic_string<char>,_double>.
     super__Move_ctor_alias<std::__cxx11::basic_string<char>,_double>.
     super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_double>.
     super__Variant_storage_alias<std::__cxx11::basic_string<char>,_double>._M_index]._M_data)
            ((anon_class_1_0_00000001 *)&local_e8._M_first,&local_c8.value);
  std::__cxx11::
  _List_base<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_>::
  _M_clear((_List_base<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_>
            *)&local_100._M_first);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,
                    CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                             local_90.field_2._M_local_buf[0]) + 1);
  }
  return (__uniq_ptr_data<ExpressionNode,_std::default_delete<ExpressionNode>,_true,_true>)
         (__uniq_ptr_data<ExpressionNode,_std::default_delete<ExpressionNode>,_true,_true>)this;
}

Assistant:

std::unique_ptr<ExpressionNode> Parser::parseFunctionCall(std::optional<Token> identifierToken)
{
  const auto mark = tokenizer_.getMark();
  std::string name;
  if(identifierToken.has_value())
    name = std::get<std::string>(identifierToken.value().value);
  else if(Token::isSpecialFunction(tokenizer_.peek()))
  {
    name = std::get<std::string>(tokenizer_.peek().value);
    tokenizer_.nextToken();
  }
  else
    name = std::get<std::string>(getToken(TokenType::Identifier, "Expected function name!").value);
  
  auto arguments = parseCallArgumentList();
  std::unique_ptr<ExpressionNode> node = std::make_unique<FunctionCallNode>(name, std::move(arguments));

  auto token = tokenizer_.peek();
  while(token.type == TokenType::LParen)
  {
    arguments = parseCallArgumentList();
    auto func = std::move(node);
    node = std::make_unique<FunctionResultCallNode>(std::move(func), std::move(arguments));
    token = tokenizer_.peek();
  }

  node->setMark(mark);
  return node;
}